

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::StandardPageSizesTestCase::iterate(StandardPageSizesTestCase *this)

{
  bool bVar1;
  int iVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  reference __p;
  MessageBuilder local_3a0;
  int local_21c;
  int local_218;
  GLint pageSizeZ;
  GLint pageSizeY;
  GLint pageSizeX;
  PageSizeStruct *page;
  PageSizeStruct **local_1f8;
  PageSizePair *format;
  _Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_> local_1e8;
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_> local_1d8;
  const_iterator formIter;
  GLint *target;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c0;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_1b8;
  const_iterator iter;
  MessageBuilder local_1a0;
  Functions *local_20;
  Functions *gl;
  StandardPageSizesTestCase *this_local;
  
  gl = (Functions *)this;
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_sparse_texture2");
  if (bVar1) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    local_20 = (Functions *)CONCAT44(extraout_var,iVar2);
    pTVar4 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_1a0,(char (*) [28])"Testing getInternalformativ");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    local_1c0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(&this->mSupportedTargets);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1b8,
               &local_1c0);
    while( true ) {
      target = (GLint *)std::vector<int,_std::allocator<int>_>::end(&this->mSupportedTargets);
      bVar1 = __gnu_cxx::operator!=
                        (&local_1b8,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &target);
      if (!bVar1) break;
      formIter._M_node =
           (_Base_ptr)
           __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&local_1b8);
      local_1e0._M_node =
           (_Base_ptr)
           std::
           map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
           ::begin(&this->mStandardVirtualPageSizesTable);
      std::_Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_>::
      _Rb_tree_const_iterator(&local_1d8,&local_1e0);
      while( true ) {
        format = (PageSizePair *)
                 std::
                 map<int,_gl4cts::PageSizeStruct,_std::less<int>,_std::allocator<std::pair<const_int,_gl4cts::PageSizeStruct>_>_>
                 ::end(&this->mStandardVirtualPageSizesTable);
        std::_Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_>::
        _Rb_tree_const_iterator(&local_1e8,(iterator *)&format);
        bVar1 = std::operator!=(&local_1d8,&local_1e8);
        if (!bVar1) break;
        __p = std::_Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_>::operator*
                        (&local_1d8);
        std::pair<int,_gl4cts::PageSizeStruct>::pair<const_int,_gl4cts::PageSizeStruct,_true>
                  ((pair<int,_gl4cts::PageSizeStruct> *)&page,__p);
        local_1f8 = &page;
        _pageSizeY = (int *)((long)&page + 4);
        SparseTextureUtils::getTexturePageSizes
                  (local_20,(formIter._M_node)->_M_color,(GLint)page,&pageSizeZ,&local_218,
                   &local_21c);
        if (((pageSizeZ != *_pageSizeY) || (local_218 != _pageSizeY[1])) ||
           (local_21c != _pageSizeY[2])) {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_3a0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_3a0,
                              (char (*) [46])"Standard Virtual Page Size mismatch, target: ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)formIter._M_node);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])", format: ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)local_1f8);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])", returned: ");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pageSizeZ);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2ba4f58);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_218);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2ba4f58);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_21c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [13])0x2a14159);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,_pageSizeY);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2ba4f58);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,_pageSizeY + 1);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2ba4f58);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,_pageSizeY + 2);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_3a0);
          tcu::TestContext::setTestResult
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                     QP_TEST_RESULT_FAIL,"Fail");
          return STOP;
        }
        std::_Rb_tree_const_iterator<std::pair<const_int,_gl4cts::PageSizeStruct>_>::operator++
                  (&local_1d8);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1b8);
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StandardPageSizesTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_texture2"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog() << tcu::TestLog::Message << "Testing getInternalformativ" << tcu::TestLog::EndMessage;

	for (std::vector<glw::GLint>::const_iterator iter = mSupportedTargets.begin(); iter != mSupportedTargets.end();
		 ++iter)
	{
		const GLint& target = *iter;

		for (std::map<glw::GLint, PageSizeStruct>::const_iterator formIter = mStandardVirtualPageSizesTable.begin();
			 formIter != mStandardVirtualPageSizesTable.end(); ++formIter)
		{
			const PageSizePair&   format = *formIter;
			const PageSizeStruct& page   = format.second;

			GLint pageSizeX;
			GLint pageSizeY;
			GLint pageSizeZ;
			SparseTextureUtils::getTexturePageSizes(gl, target, format.first, pageSizeX, pageSizeY, pageSizeZ);

			if (pageSizeX != page.xSize || pageSizeY != page.ySize || pageSizeZ != page.zSize)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Standard Virtual Page Size mismatch, target: " << target
								   << ", format: " << format.first << ", returned: " << pageSizeX << "/" << pageSizeY
								   << "/" << pageSizeZ << ", expected: " << page.xSize << "/" << page.ySize << "/"
								   << page.zSize << tcu::TestLog::EndMessage;

				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
				return STOP;
			}
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}